

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::generateIntensity(Station *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDI;
  int j;
  int i;
  int a;
  pair<int,_int> aux;
  int in_stack_00000048;
  int in_stack_0000004c;
  Station *in_stack_00000050;
  Collimator *in_stack_ffffffffffffffb8;
  int local_24;
  pair<int,_int> in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  pair<int,_int> local_10 [2];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_10);
  clearIntensity((Station *)in_stack_ffffffffffffffe0);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x40); local_14 = local_14 + 1) {
    for (local_18 = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        local_18 < iVar1; local_18 = local_18 + 1) {
      Collimator::getActiveRange(in_stack_ffffffffffffffb8,0,0x142478);
      std::pair<int,_int>::operator=(local_10,(type)&stack0xffffffffffffffe0);
      if (-1 < local_10[0].first) {
        pvVar2 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RDI + 0x58),(long)local_14);
        pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar2,(long)local_18);
        if (-1 < pvVar3->first) {
          pvVar2 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RDI + 0x58),(long)local_14);
          pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar2,(long)local_18);
          local_24 = pvVar3->first;
          while( true ) {
            pvVar2 = std::
                     vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                   *)(in_RDI + 0x58),(long)local_14);
            pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[](pvVar2,(long)local_18);
            if (pvVar3->second < local_24) break;
            pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_18,local_24);
            in_stack_ffffffffffffffb8 = (Collimator *)*pdVar4;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)local_14);
            change_intensity(in_stack_00000050,in_stack_0000004c,in_stack_00000048,(double)this,
                             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)aux);
            local_24 = local_24 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Station::generateIntensity(){
    pair <int,int>aux;
    clearIntensity();
    //printIntensity();
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        aux = collimator.getActiveRange(i,angle);
        if (aux.first<0 || A[a][i].first<0) continue;
        //for (int j=aux.first; j<=aux.second; j++) {
        for (int j=A[a][i].first; j<=A[a][i].second; j++) {
          //if (j>=A[a][i].first && j<=A[a][i].second){
            //cout << "a:" <<a << " i:" << i << " j:" <<j << " to add:" <<  intensity[a] << " on:" << I(i,j) <<  endl;
            change_intensity(i, j, I(i,j)+intensity[a]);
          //}
        }
      }
    }
  }